

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::source_location_formatter<spdlog::details::scoped_padder>::format
          (source_location_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  char *__s;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  char *buf_ptr;
  format_decimal_result<char_*> fVar7;
  scoped_padder p;
  scoped_padder sStack_68;
  char local_40 [21];
  char acStack_2b [3];
  char *local_28;
  
  if ((msg->source).line == 0) {
    scoped_padder::scoped_padder(&sStack_68,0,&(this->super_flag_formatter).padinfo_,dest);
  }
  else {
    if ((this->super_flag_formatter).padinfo_.enabled_ == true) {
      sVar3 = strlen((msg->source).filename);
      uVar1 = (msg->source).line;
      uVar4 = uVar1 | 1;
      uVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      sVar5 = sVar3 + ((ulong)uVar1 +
                       *(long *)(fmt::v9::detail::do_count_digits(unsigned_int)::table +
                                (ulong)uVar2 * 8) >> 0x20) + 1;
    }
    else {
      sVar5 = 0;
    }
    scoped_padder::scoped_padder(&sStack_68,sVar5,&(this->super_flag_formatter).padinfo_,dest);
    __s = (msg->source).filename;
    sVar3 = strlen(__s);
    fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,__s,__s + sVar3);
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar5 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar5 + 1;
    (dest->super_buffer<char>).ptr_[sVar5] = ':';
    uVar1 = (msg->source).line;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    fVar7 = fmt::v9::detail::format_decimal<char,unsigned_int>(local_40,uVar2,0x15);
    local_28 = fVar7.begin;
    if ((int)uVar1 < 0) {
      local_28[-1] = '-';
      local_28 = local_28 + -1;
    }
    lVar6 = (long)local_40 - (long)local_28;
    if (lVar6 < -0x15) {
      fmt::v9::detail::assert_fail
                ("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                 ,0x199,"negative value");
    }
    fmt::v9::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_28,local_28 + lVar6 + 0x15);
  }
  scoped_padder::~scoped_padder(&sStack_68);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }

        size_t text_size;
        if (padinfo_.enabled()) {
            // calc text size for padding based on "filename:line"
            text_size = std::char_traits<char>::length(msg.source.filename) +
                        ScopedPadder::count_digits(msg.source.line) + 1;
        } else {
            text_size = 0;
        }

        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.filename, dest);
        dest.push_back(':');
        fmt_helper::append_int(msg.source.line, dest);
    }